

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

void __thiscall
IntBounds::SetBound<true>
          (IntBounds *this,int constantBoundBase,int offset,bool wasEstablishedExplicitly)

{
  int iVar1;
  bool bVar2;
  int local_20;
  undefined1 local_19;
  int constantBound;
  int iStack_14;
  bool wasEstablishedExplicitly_local;
  int offset_local;
  int constantBoundBase_local;
  IntBounds *this_local;
  
  iVar1 = constantBoundBase;
  local_19 = wasEstablishedExplicitly;
  constantBound = offset;
  iStack_14 = constantBoundBase;
  _offset_local = this;
  if ((offset == 0) ||
     (bVar2 = Int32Math::Add(constantBoundBase,offset,&local_20), iVar1 = local_20, !bVar2)) {
    local_20 = iVar1;
    SetLowerBound(this,local_20);
  }
  return;
}

Assistant:

void IntBounds::SetBound(const int constantBoundBase, const int offset, const bool wasEstablishedExplicitly)
{
    int constantBound;
    if(offset == 0)
        constantBound = constantBoundBase;
    else if(Int32Math::Add(constantBoundBase, offset, &constantBound))
        return;

    if(Lower)
        SetLowerBound(constantBound);
    else
        SetUpperBound(constantBound, wasEstablishedExplicitly);
}